

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Int_t * Saig_ManBmcComputeMappingRefs(Aig_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  int *piVar3;
  int *pData;
  int iFan;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRefs;
  Vec_Int_t *vMap_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Vec_IntStart(iVar1);
  for (pData._4_4_ = 0; iVar1 = Vec_PtrSize(p->vCos), pData._4_4_ < iVar1;
      pData._4_4_ = pData._4_4_ + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,pData._4_4_);
    iVar1 = Aig_ObjFaninId0(pAVar2);
    Vec_IntAddToEntry(p_00,iVar1,1);
  }
  for (pData._4_4_ = 0; iVar1 = Vec_PtrSize(p->vObjs), pData._4_4_ < iVar1;
      pData._4_4_ = pData._4_4_ + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,pData._4_4_);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (iVar1 = Vec_IntEntry(vMap,pData._4_4_), iVar1 != 0)) {
      iVar1 = Vec_IntEntry(vMap,pData._4_4_);
      piVar3 = Vec_IntEntryP(vMap,iVar1);
      for (pData._0_4_ = 0; (int)pData < 4; pData._0_4_ = (int)pData + 1) {
        if (-1 < piVar3[(int)pData + 1]) {
          Vec_IntAddToEntry(p_00,piVar3[(int)pData + 1],1);
        }
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Saig_ManBmcComputeMappingRefs( Aig_Man_t * p, Vec_Int_t * vMap )
{
    Vec_Int_t * vRefs;
    Aig_Obj_t * pObj;
    int i, iFan, * pData;
    vRefs = Vec_IntStart( Aig_ManObjNumMax(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntAddToEntry( vRefs, Aig_ObjFaninId0(pObj), 1 );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMap, Vec_IntEntry(vMap, i) );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                Vec_IntAddToEntry( vRefs, pData[iFan+1], 1 );
    }
    return vRefs;
}